

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

size_t fio_ftoa(char *dest,double num,uint8_t base)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  byte *pbVar4;
  undefined7 in_register_00000031;
  
  iVar2 = (int)CONCAT71(in_register_00000031,base);
  if ((iVar2 == 0x10) || (iVar2 == 2)) {
    sVar3 = fio_ltoa(dest,(int64_t)num,base);
    return sVar3;
  }
  iVar2 = sprintf(dest,"%g");
  sVar3 = (size_t)iVar2;
  pbVar4 = (byte *)dest;
  do {
    bVar1 = *pbVar4;
    if (bVar1 < 0x2e) {
      if (bVar1 == 0) {
        (dest + sVar3)[0] = '.';
        (dest + sVar3)[1] = '0';
        return sVar3 + 2;
      }
      if (bVar1 == 0x2c) {
        *pbVar4 = 0x2e;
        return sVar3;
      }
    }
    else {
      if (bVar1 == 0x2e) {
        return sVar3;
      }
      if (bVar1 == 0x65) {
        return sVar3;
      }
    }
    pbVar4 = pbVar4 + 1;
  } while( true );
}

Assistant:

size_t fio_ftoa(char *dest, double num, uint8_t base) {
  if (base == 2 || base == 16) {
    /* handle the binary / Hex representation the same as if it were an
     * int64_t
     */
    int64_t *i = (void *)&num;
    return fio_ltoa(dest, *i, base);
  }

  size_t written = sprintf(dest, "%g", num);
  uint8_t need_zero = 1;
  char *start = dest;
  while (*start) {
    if (*start == ',') // locale issues?
      *start = '.';
    if (*start == '.' || *start == 'e') {
      need_zero = 0;
      break;
    }
    start++;
  }
  if (need_zero) {
    dest[written++] = '.';
    dest[written++] = '0';
  }
  return written;
}